

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O0

void pstore::command_line::details::report_unknown_option<std::ostream>
               (string *program_name,string *arg_name,string *value,
               basic_ostream<char,_std::char_traits<char>_> *errs)

{
  char *pcVar1;
  type tVar2;
  bool bVar3;
  string *psVar4;
  ostream *poVar5;
  czstring pcVar6;
  options_container *all_options;
  option **ppoVar7;
  size_t sVar8;
  ulong uVar9;
  allocator local_91;
  string local_90 [32];
  char *local_70;
  czstring dashes;
  string local_58 [8];
  string nearest_string;
  undefined1 local_38 [8];
  maybe<pstore::command_line::option_*,_void> best_option;
  basic_ostream<char,_std::char_traits<char>_> *errs_local;
  string *value_local;
  string *arg_name_local;
  string *program_name_local;
  
  best_option.storage_ = (type)errs;
  psVar4 = stream_trait<char>::out_string(program_name);
  poVar5 = std::operator<<(errs,(string *)psVar4);
  pcVar6 = stream_trait<char>::out_text(": Unknown command line argument \'");
  poVar5 = std::operator<<(poVar5,pcVar6);
  psVar4 = stream_trait<char>::out_string(arg_name);
  poVar5 = std::operator<<(poVar5,(string *)psVar4);
  pcVar6 = stream_trait<char>::out_text("\'\n");
  std::operator<<(poVar5,pcVar6);
  all_options = option::all_abi_cxx11_();
  lookup_nearest_option
            ((maybe<pstore::command_line::option_*,_void> *)local_38,arg_name,all_options);
  bVar3 = maybe::operator_cast_to_bool((maybe *)local_38);
  if (bVar3) {
    ppoVar7 = maybe<pstore::command_line::option_*,_void>::operator*
                        ((maybe<pstore::command_line::option_*,_void> *)local_38);
    psVar4 = option::name_abi_cxx11_(*ppoVar7);
    std::__cxx11::string::string(local_58,(string *)psVar4);
    sVar8 = utf::length((string *)local_58);
    local_70 = "--";
    if (sVar8 < 2) {
      local_70 = "-";
    }
    uVar9 = std::__cxx11::string::empty();
    if ((uVar9 & 1) == 0) {
      std::__cxx11::string::operator+=(local_58,'=');
      std::__cxx11::string::operator+=(local_58,(string *)value);
    }
    tVar2 = best_option.storage_;
    pcVar6 = stream_trait<char>::out_text("Did you mean \'");
    poVar5 = std::operator<<((ostream *)tVar2,pcVar6);
    pcVar1 = local_70;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,pcVar1,&local_91);
    psVar4 = stream_trait<char>::out_string((string *)local_90);
    poVar5 = std::operator<<(poVar5,(string *)psVar4);
    psVar4 = stream_trait<char>::out_string((string *)local_58);
    poVar5 = std::operator<<(poVar5,(string *)psVar4);
    pcVar6 = stream_trait<char>::out_text("\'?\n");
    std::operator<<(poVar5,pcVar6);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::__cxx11::string::~string(local_58);
  }
  maybe<pstore::command_line::option_*,_void>::~maybe
            ((maybe<pstore::command_line::option_*,_void> *)local_38);
  return;
}

Assistant:

void report_unknown_option (std::string const & program_name,
                                        std::string const & arg_name, std::string const & value,
                                        ErrorStream & errs) {
                using str = stream_trait<typename ErrorStream::char_type>;
                errs << str::out_string (program_name)
                     << str::out_text (": Unknown command line argument '")
                     << str::out_string (arg_name) << str::out_text ("'\n");

                if (maybe<option *> const best_option =
                        lookup_nearest_option (arg_name, option::all ())) {
                    std::string nearest_string = (*best_option)->name ();
                    gsl::czstring const dashes = utf::length (nearest_string) < 2U ? "-" : "--";
                    if (!value.empty ()) {
                        nearest_string += '=';
                        nearest_string += value;
                    }
                    errs << str::out_text ("Did you mean '") << str::out_string (dashes)
                         << str::out_string (nearest_string) << str::out_text ("'?\n");
                }
            }